

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexRecover(Wal *pWal)

{
  u32 uVar1;
  u32 *puVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ulong n;
  u8 *aFrame;
  sqlite3_int64 sVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  i64 nSize;
  u32 nTruncate;
  u32 pgno;
  u8 aBuf [32];
  u32 local_94;
  long local_78;
  u32 local_70;
  u32 local_6c;
  u8 *local_68;
  sqlite3_int64 local_60;
  uint local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  
  iVar8 = 7 - (uint)pWal->ckptLock;
  iVar7 = pWal->ckptLock + 1;
  iVar5 = 0;
  if (pWal->exclusiveMode == '\0') {
    iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar7,iVar8,10);
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  (pWal->hdr).aSalt[0] = 0;
  (pWal->hdr).aSalt[1] = 0;
  (pWal->hdr).aCksum[0] = 0;
  (pWal->hdr).aCksum[1] = 0;
  (pWal->hdr).mxFrame = 0;
  (pWal->hdr).nPage = 0;
  (pWal->hdr).aFrameCksum[0] = 0;
  (pWal->hdr).aFrameCksum[1] = 0;
  (pWal->hdr).iVersion = 0;
  (pWal->hdr).unused = 0;
  (pWal->hdr).iChange = 0;
  (pWal->hdr).isInit = '\0';
  (pWal->hdr).bigEndCksum = '\0';
  (pWal->hdr).szPage = 0;
  iVar5 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_78);
  if (iVar5 != 0) goto LAB_00123473;
  iVar5 = 0;
  if (local_78 < 0x21) {
LAB_001233fc:
    if (iVar5 == 0) {
      (pWal->hdr).aFrameCksum[0] = 0;
      (pWal->hdr).aFrameCksum[1] = 0;
      walIndexWriteHdr(pWal);
      puVar2 = *pWal->apWiData;
      lVar9 = 0;
      puVar2[0x18] = 0;
      puVar2[0x20] = (pWal->hdr).mxFrame;
      puVar2[0x19] = 0;
      do {
        puVar2[lVar9 + 0x1a] = 0xffffffff;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      uVar1 = (pWal->hdr).mxFrame;
      if (uVar1 != 0) {
        puVar2[0x1a] = uVar1;
      }
      if ((pWal->hdr).nPage == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                    pWal->zWalName);
      }
    }
LAB_00123473:
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar7,iVar8,9);
    }
    return iVar5;
  }
  iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_58,0x20,0);
  if (iVar5 == 0) {
    lVar9 = 3;
    if ((local_58 >> 0x18 & 0xfffffffe | (local_58 & 0xff0000) >> 8 | (local_58 & 0xff00) << 8 |
        local_58 << 0x18) != 0x377f0682) goto LAB_001233ea;
    uVar10 = local_50 >> 0x18 | (local_50 & 0xff0000) >> 8 | (local_50 & 0xff00) << 8 |
             local_50 << 0x18;
    if (uVar10 - 0x10001 < 0xffff01ff || (local_50 & local_50 - 1) != 0) goto LAB_001233ea;
    bVar4 = (byte)(local_58 >> 0x18) & 1;
    (pWal->hdr).bigEndCksum = bVar4;
    pWal->szPage = uVar10;
    pWal->nCkpt = local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 | (local_4c & 0xff00) << 8 |
                  local_4c << 0x18;
    *(undefined8 *)(pWal->hdr).aSalt = local_48;
    walChecksumBytes((uint)(bVar4 ^ 1),(u8 *)&local_58,0x18,(u32 *)0x0,(pWal->hdr).aFrameCksum);
    if ((pWal->hdr).aFrameCksum[0] !=
        (local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 | local_40 << 0x18
        )) {
      lVar9 = 3;
      goto LAB_001233ea;
    }
    lVar9 = 3;
    if ((pWal->hdr).aFrameCksum[1] !=
        (local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 | local_3c << 0x18
        )) goto LAB_001233ea;
    if (local_54 != 0x18e22d00) {
      iVar5 = 0xe;
      sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xd8af,
                  "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
      goto LAB_001233fc;
    }
    n = (ulong)(uVar10 + 0x18);
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      aFrame = (u8 *)sqlite3Malloc(n);
    }
    else {
      aFrame = (u8 *)0x0;
    }
    if (aFrame != (u8 *)0x0) {
      if ((long)(n + 0x20) <= local_78) {
        local_68 = aFrame + 0x18;
        sVar6 = 0x20;
        local_94 = 1;
        do {
          local_60 = sVar6;
          iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,uVar10 + 0x18,sVar6);
          if (((iVar5 == 0) &&
              (iVar5 = walDecodeFrame(pWal,&local_6c,&local_70,local_68,aFrame), iVar5 != 0)) &&
             (iVar5 = walIndexAppend(pWal,local_94,local_6c), iVar5 == 0)) {
            bVar3 = true;
            if (local_70 != 0) {
              (pWal->hdr).mxFrame = local_94;
              (pWal->hdr).nPage = local_70;
              (pWal->hdr).szPage = (ushort)(uVar10 >> 0x10) | (ushort)((local_50 & 0xff0000) >> 8);
            }
          }
          else {
            bVar3 = false;
          }
          if (!bVar3) break;
          sVar6 = local_60 + n;
          local_94 = local_94 + 1;
        } while ((long)(n + sVar6) <= local_78);
      }
      sqlite3_free(aFrame);
      lVar9 = 0;
      goto LAB_001233ea;
    }
  }
  lVar9 = 2;
LAB_001233ea:
  iVar5 = (*(code *)((long)&DAT_0017e1c0 + (long)(int)(&DAT_0017e1c0)[lVar9]))();
  return iVar5;
}

Assistant:

static int walIndexRecover(Wal *pWal){
  int rc;                         /* Return Code */
  i64 nSize;                      /* Size of log file */
  u32 aFrameCksum[2] = {0, 0};
  int iLock;                      /* Lock offset to lock for checkpoint */
  int nLock;                      /* Number of locks to hold */

  /* Obtain an exclusive lock on all byte in the locking range not already
  ** locked by the caller. The caller is guaranteed to have locked the
  ** WAL_WRITE_LOCK byte, and may have also locked the WAL_CKPT_LOCK byte.
  ** If successful, the same bytes that are locked here are unlocked before
  ** this function returns.
  */
  assert( pWal->ckptLock==1 || pWal->ckptLock==0 );
  assert( WAL_ALL_BUT_WRITE==WAL_WRITE_LOCK+1 );
  assert( WAL_CKPT_LOCK==WAL_ALL_BUT_WRITE );
  assert( pWal->writeLock );
  iLock = WAL_ALL_BUT_WRITE + pWal->ckptLock;
  nLock = SQLITE_SHM_NLOCK - iLock;
  rc = walLockExclusive(pWal, iLock, nLock);
  if( rc ){
    return rc;
  }
  WALTRACE(("WAL%p: recovery begin...\n", pWal));

  memset(&pWal->hdr, 0, sizeof(WalIndexHdr));

  rc = sqlite3OsFileSize(pWal->pWalFd, &nSize);
  if( rc!=SQLITE_OK ){
    goto recovery_error;
  }

  if( nSize>WAL_HDRSIZE ){
    u8 aBuf[WAL_HDRSIZE];         /* Buffer to load WAL header into */
    u8 *aFrame = 0;               /* Malloc'd buffer to load entire frame */
    int szFrame;                  /* Number of bytes in buffer aFrame[] */
    u8 *aData;                    /* Pointer to data part of aFrame buffer */
    int iFrame;                   /* Index of last frame read */
    i64 iOffset;                  /* Next offset to read from log file */
    int szPage;                   /* Page size according to the log */
    u32 magic;                    /* Magic value read from WAL header */
    u32 version;                  /* Magic value read from WAL header */
    int isValid;                  /* True if this frame is valid */

    /* Read in the WAL header. */
    rc = sqlite3OsRead(pWal->pWalFd, aBuf, WAL_HDRSIZE, 0);
    if( rc!=SQLITE_OK ){
      goto recovery_error;
    }

    /* If the database page size is not a power of two, or is greater than
    ** SQLITE_MAX_PAGE_SIZE, conclude that the WAL file contains no valid 
    ** data. Similarly, if the 'magic' value is invalid, ignore the whole
    ** WAL file.
    */
    magic = sqlite3Get4byte(&aBuf[0]);
    szPage = sqlite3Get4byte(&aBuf[8]);
    if( (magic&0xFFFFFFFE)!=WAL_MAGIC 
     || szPage&(szPage-1) 
     || szPage>SQLITE_MAX_PAGE_SIZE 
     || szPage<512 
    ){
      goto finished;
    }
    pWal->hdr.bigEndCksum = (u8)(magic&0x00000001);
    pWal->szPage = szPage;
    pWal->nCkpt = sqlite3Get4byte(&aBuf[12]);
    memcpy(&pWal->hdr.aSalt, &aBuf[16], 8);

    /* Verify that the WAL header checksum is correct */
    walChecksumBytes(pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN, 
        aBuf, WAL_HDRSIZE-2*4, 0, pWal->hdr.aFrameCksum
    );
    if( pWal->hdr.aFrameCksum[0]!=sqlite3Get4byte(&aBuf[24])
     || pWal->hdr.aFrameCksum[1]!=sqlite3Get4byte(&aBuf[28])
    ){
      goto finished;
    }

    /* Verify that the version number on the WAL format is one that
    ** are able to understand */
    version = sqlite3Get4byte(&aBuf[4]);
    if( version!=WAL_MAX_VERSION ){
      rc = SQLITE_CANTOPEN_BKPT;
      goto finished;
    }

    /* Malloc a buffer to read frames into. */
    szFrame = szPage + WAL_FRAME_HDRSIZE;
    aFrame = (u8 *)sqlite3_malloc64(szFrame);
    if( !aFrame ){
      rc = SQLITE_NOMEM_BKPT;
      goto recovery_error;
    }
    aData = &aFrame[WAL_FRAME_HDRSIZE];

    /* Read all frames from the log file. */
    iFrame = 0;
    for(iOffset=WAL_HDRSIZE; (iOffset+szFrame)<=nSize; iOffset+=szFrame){
      u32 pgno;                   /* Database page number for frame */
      u32 nTruncate;              /* dbsize field from frame header */

      /* Read and decode the next log frame. */
      iFrame++;
      rc = sqlite3OsRead(pWal->pWalFd, aFrame, szFrame, iOffset);
      if( rc!=SQLITE_OK ) break;
      isValid = walDecodeFrame(pWal, &pgno, &nTruncate, aData, aFrame);
      if( !isValid ) break;
      rc = walIndexAppend(pWal, iFrame, pgno);
      if( rc!=SQLITE_OK ) break;

      /* If nTruncate is non-zero, this is a commit record. */
      if( nTruncate ){
        pWal->hdr.mxFrame = iFrame;
        pWal->hdr.nPage = nTruncate;
        pWal->hdr.szPage = (u16)((szPage&0xff00) | (szPage>>16));
        testcase( szPage<=32768 );
        testcase( szPage>=65536 );
        aFrameCksum[0] = pWal->hdr.aFrameCksum[0];
        aFrameCksum[1] = pWal->hdr.aFrameCksum[1];
      }
    }

    sqlite3_free(aFrame);
  }

finished:
  if( rc==SQLITE_OK ){
    volatile WalCkptInfo *pInfo;
    int i;
    pWal->hdr.aFrameCksum[0] = aFrameCksum[0];
    pWal->hdr.aFrameCksum[1] = aFrameCksum[1];
    walIndexWriteHdr(pWal);

    /* Reset the checkpoint-header. This is safe because this thread is 
    ** currently holding locks that exclude all other readers, writers and
    ** checkpointers.
    */
    pInfo = walCkptInfo(pWal);
    pInfo->nBackfill = 0;
    pInfo->nBackfillAttempted = pWal->hdr.mxFrame;
    pInfo->aReadMark[0] = 0;
    for(i=1; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
    if( pWal->hdr.mxFrame ) pInfo->aReadMark[1] = pWal->hdr.mxFrame;

    /* If more than one frame was recovered from the log file, report an
    ** event via sqlite3_log(). This is to help with identifying performance
    ** problems caused by applications routinely shutting down without
    ** checkpointing the log file.
    */
    if( pWal->hdr.nPage ){
      sqlite3_log(SQLITE_NOTICE_RECOVER_WAL,
          "recovered %d frames from WAL file %s",
          pWal->hdr.mxFrame, pWal->zWalName
      );
    }
  }

recovery_error:
  WALTRACE(("WAL%p: recovery %s\n", pWal, rc ? "failed" : "ok"));
  walUnlockExclusive(pWal, iLock, nLock);
  return rc;
}